

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentQMDP.cpp
# Opt level: O2

Index __thiscall AgentQMDP::Act(AgentQMDP *this,Index joI)

{
  undefined1 auVar1 [16];
  Index IVar2;
  DecPOMDPDiscreteInterface *pDVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  size_t a;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> aIs;
  double local_50;
  double local_48;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  undefined1 extraout_var [56];
  
  if (this->_m_t != 0) {
    pDVar3 = ((this->super_AgentSharedObservations).super_AgentDecPOMDPDiscrete._m_pu)->_m_DecPOMDP;
    JointBeliefSparse::Update
              (&this->_m_jb,
               (MultiAgentDecisionProcessDiscreteInterface *)
               ((long)&pDVar3->field_0x0 + *(long *)(*(long *)pDVar3 + -0xb8)),this->_m_prevJaI,joI)
    ;
  }
  uVar7 = 0x7fffffff;
  uVar8 = 0;
  local_48 = -1.79769313486232e+308;
  while( true ) {
    uVar5 = (**(code **)((long)*(((this->super_AgentSharedObservations).super_AgentDecPOMDPDiscrete.
                                 _m_pu)->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
    if (uVar8 == uVar5) break;
    uVar4 = 0;
    local_50 = 0.0;
    while( true ) {
      sVar6 = PlanningUnitMADPDiscrete::GetNrStates
                        (&((this->super_AgentSharedObservations).super_AgentDecPOMDPDiscrete._m_pu)
                          ->super_PlanningUnitMADPDiscrete);
      if (sVar6 == uVar4) break;
      auVar10._0_8_ =
           BeliefSparse::Get((BeliefSparse *)
                             (&(this->_m_jb).field_0x0 + *(long *)(*(long *)&this->_m_jb + -0xd8)),
                             uVar4);
      auVar10._8_56_ = extraout_var;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_50;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (this->_m_Q).super_matrix_t.data_.data_
                     [(ulong)uVar4 * (this->_m_Q).super_matrix_t.size2_ + uVar8];
      auVar9 = vfmadd231sd_fma(auVar11,auVar10._0_16_,auVar1);
      uVar4 = uVar4 + 1;
      local_50 = auVar9._0_8_;
    }
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_48;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_50;
    auVar9 = vmaxsd_avx(auVar12,auVar9);
    if (local_48 < local_50) {
      uVar7 = uVar8 & 0xffffffff;
    }
    uVar8 = uVar8 + 1;
    local_48 = auVar9._0_8_;
  }
  PlanningUnitMADPDiscrete::JointToIndividualActionIndices
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40,
             &((this->super_AgentSharedObservations).super_AgentDecPOMDPDiscrete._m_pu)->
              super_PlanningUnitMADPDiscrete,(Index)uVar7);
  uVar4 = (*(this->super_AgentSharedObservations).super_AgentDecPOMDPDiscrete.super_SimulationAgent.
            _vptr_SimulationAgent[2])(this);
  IVar2 = local_40._M_impl.super__Vector_impl_data._M_start[uVar4];
  this->_m_prevJaI = (Index)uVar7;
  this->_m_t = this->_m_t + 1;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_40);
  return IVar2;
}

Assistant:

Index AgentQMDP::Act(Index joI)
{
    if(_m_t>0)
        _m_jb.Update(*GetPU()->GetDPOMDPD(),_m_prevJaI,joI);

    Index jaInew=INT_MAX,aI;
    double q,v=-DBL_MAX;
    for(size_t a=0;a!=GetPU()->GetNrJointActions();++a)
    {
        q=0;
        for(unsigned s=0;s!=GetPU()->GetNrStates();++s)
            q+=_m_jb.Get(s)*_m_Q(s,a);

//        if(q>(v+PROB_PRECISION))
        if(q>v)
        {
            v=q;
            jaInew=a;
        }
    }

    vector<Index> aIs=GetPU()->JointToIndividualActionIndices(jaInew);
    aI=aIs[GetIndex()];

    _m_prevJaI=jaInew;
    _m_t++;

#if DEBUG_AgentQMDP
    cout << GetIndex() << ": ";
    _m_jb.Print();
    cout << " v " << v << " ja " << jaInew << " aI " << aI << endl;
#endif

    return(aI);
}